

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

void ecs_run_add_actions(ecs_world_t *world,ecs_table_t *table,ecs_data_t *data,int32_t row,
                        int32_t count,ecs_entities_t *added,_Bool get_all,_Bool run_on_set)

{
  int iVar1;
  ecs_vector_t *trigger_vec;
  _Bool _Var2;
  uint uVar3;
  ecs_table_t *node;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ecs_entity_t component;
  ecs_entities_t to_remove;
  ecs_column_info_t cinfo [32];
  ulong local_380;
  int32_t local_374;
  ecs_table_t *local_370;
  ecs_entities_t local_368;
  ulong local_358;
  ecs_entities_t *local_350;
  ecs_type_t local_348;
  ecs_column_t *local_340;
  ecs_column_info_t local_338 [32];
  
  _ecs_assert(added != (ecs_entities_t *)0x0,0xc,(char *)0x0,"added != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x374);
  if (added == (ecs_entities_t *)0x0) {
    __assert_fail("added != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x374,
                  "void ecs_run_add_actions(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool, _Bool)"
                 );
  }
  _ecs_assert(added->count < 0x20,2,(char *)0x0,"added->count < ECS_MAX_ADD_REMOVE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x375);
  if (0x1f < added->count) {
    __assert_fail("added->count < (32)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x375,
                  "void ecs_run_add_actions(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool, _Bool)"
                 );
  }
  ecs_get_column_info(world,table,added,local_338,get_all);
  uVar3 = added->count;
  uVar4 = (ulong)uVar3;
  if ((table->flags & 4) != 0) {
    _ecs_assert(data != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x2c2);
    if (data == (ecs_data_t *)0x0) {
      __assert_fail("data != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x2c2,
                    "void ecs_components_override(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t, _Bool)"
                   );
    }
    _ecs_assert(uVar4 != 0,0xc,(char *)0x0,"component_count != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x2c3);
    if (uVar4 == 0) {
      __assert_fail("component_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x2c3,
                    "void ecs_components_override(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t, _Bool)"
                   );
    }
    if (0 < (int)uVar3) {
      local_340 = data->columns;
      local_348 = table->type;
      local_374 = table->column_count;
      lVar6 = uVar4 * 0x18;
      lVar5 = 0;
      node = table;
      local_370 = table;
      local_358 = uVar4;
      local_350 = added;
      do {
        uVar4 = *(ulong *)((long)&local_338[0].id + lVar5);
        local_380 = uVar4;
        if ((char)(uVar4 >> 0x38) == -2) {
          _ecs_assert((uVar4 & 0xffffffffffffff) != 0,2,(char *)0x0,"base != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x2d3);
          if ((uVar4 & 0xffffffffffffff) == 0) {
            __assert_fail("base != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                          ,0x2d3,
                          "void ecs_components_override(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t, _Bool)"
                         );
          }
          instantiate(world,uVar4 & 0xffffffffffffff,local_370,data,row,count);
          local_368.array = &local_380;
          local_368.count = 1;
          node = ecs_table_traverse_remove(world,node,&local_368,(ecs_entities_t *)0x0);
        }
        iVar1 = *(int *)((long)&local_338[0].column + lVar5);
        if (((long)iVar1 != -1) && (iVar1 < local_374)) {
          _Var2 = override_component(world,local_380,local_348,data,local_340 + iVar1,row,count);
          if (_Var2) {
            local_368.array = &local_380;
            local_368.count = 1;
            node = ecs_table_traverse_remove(world,node,&local_368,(ecs_entities_t *)0x0);
          }
        }
        added = local_350;
        uVar4 = local_358;
        table = local_370;
        lVar5 = lVar5 + 0x18;
      } while (lVar6 != lVar5);
      if (run_on_set && node != local_370) {
        ecs_run_monitors(world,local_370,local_370->on_set_all,row,count,node->on_set_all);
      }
    }
  }
  uVar3 = table->flags;
  if ((uVar3 >> 0x10 & 1) != 0) {
    set_switch(world,table,data,row,count,(ecs_entities_t *)added->array,SUB41(added->count,0));
    uVar3 = table->flags;
  }
  if ((uVar3 >> 0xb & 1) != 0) {
    _ecs_assert(data != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x340);
    if (data == (ecs_data_t *)0x0) {
      __assert_fail("data != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x340,
                    "void ecs_components_on_add(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_column_info_t *, int32_t)"
                   );
    }
    if (0 < (int)uVar4) {
      lVar6 = 0;
      do {
        lVar5 = *(long *)((long)&local_338[0].ci + lVar6);
        if ((lVar5 != 0) &&
           (trigger_vec = *(ecs_vector_t **)(lVar5 + 8), trigger_vec != (ecs_vector_t *)0x0)) {
          ecs_run_component_trigger
                    (world,trigger_vec,*(ecs_entity_t *)((long)&local_338[0].id + lVar6),table,data,
                     row,count);
        }
        lVar6 = lVar6 + 0x18;
      } while (uVar4 * 0x18 != lVar6);
    }
  }
  return;
}

Assistant:

void ecs_run_add_actions(
    ecs_world_t * world,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,
    ecs_entities_t * added,
    bool get_all,
    bool run_on_set)
{
    ecs_assert(added != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(added->count < ECS_MAX_ADD_REMOVE, ECS_INVALID_PARAMETER, NULL);

    ecs_column_info_t cinfo[ECS_MAX_ADD_REMOVE];
    ecs_get_column_info(world, table, added, cinfo, get_all);
    int added_count = added->count;

    if (table->flags & EcsTableHasBase) {
        ecs_components_override(
            world, table, data, row, count, cinfo, 
            added_count, run_on_set);
    }

    if (table->flags & EcsTableHasSwitch) {
        ecs_components_switch(world, table, data, row, count, added, NULL);
    }

    if (table->flags & EcsTableHasOnAdd) {
        ecs_components_on_add(world, table, data, row, count, 
            cinfo, added_count);
    }
}